

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzAdd2(word *b,word *a,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word carry;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = a[i] + carry;
    b[i] = uVar1 + b[i];
    carry = (word)(int)(uint)(b[i] < uVar1 || uVar1 < carry);
  }
  return carry;
}

Assistant:

word zzAdd2(word b[], const word a[], size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		b[i] += w;
		carry |= wordLess01(b[i], w);
#else
		w = a[i] + carry;
		if (w >= carry)
			w += b[i], carry = w < b[i], b[i] = w;
#endif
	}
	w = 0;
	return carry;
}